

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int BN_asc2bn(BIGNUM **a,char *str)

{
  int iVar1;
  char *orig_in;
  char *in_local;
  BIGNUM **outp_local;
  
  orig_in = str;
  if (*str == '-') {
    orig_in = str + 1;
  }
  if ((*orig_in == '0') && ((orig_in[1] == 'X' || (orig_in[1] == 'x')))) {
    iVar1 = BN_hex2bn(a,orig_in + 2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = BN_dec2bn(a,orig_in);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((*str == '-') && (iVar1 = BN_is_zero((BIGNUM *)*a), iVar1 == 0)) {
    (*a)->neg = 1;
  }
  return 1;
}

Assistant:

int BN_asc2bn(BIGNUM **outp, const char *in) {
  const char *const orig_in = in;
  if (*in == '-') {
    in++;
  }

  if (in[0] == '0' && (in[1] == 'X' || in[1] == 'x')) {
    if (!BN_hex2bn(outp, in + 2)) {
      return 0;
    }
  } else {
    if (!BN_dec2bn(outp, in)) {
      return 0;
    }
  }

  if (*orig_in == '-' && !BN_is_zero(*outp)) {
    (*outp)->neg = 1;
  }

  return 1;
}